

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,size_t max_backward_limit,ZopfliNode *nodes,
               int *dist_cache,size_t *last_insert_len,BrotliEncoderParams *params,Command *commands
               ,size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint16_t *puVar21;
  bool bVar22;
  
  uVar5 = (nodes->u).next;
  if (uVar5 == 0xffffffff) {
    lVar20 = 0;
  }
  else {
    puVar21 = &commands->dist_prefix_;
    lVar12 = 0;
    lVar20 = 0;
    do {
      uVar6 = (ulong)uVar5;
      uVar18 = nodes[lVar20 + uVar6].length;
      uVar19 = nodes[lVar20 + uVar6].dcode_insert_length;
      uVar13 = (ulong)(uVar19 & 0x7ffffff);
      uVar5 = nodes[lVar20 + uVar6].u.next;
      bVar22 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      uVar8 = uVar13;
      if (bVar22) {
        uVar8 = *last_insert_len + uVar13;
        *last_insert_len = 0;
      }
      uVar11 = uVar18 & 0x1ffffff;
      uVar1 = nodes[lVar20 + uVar6].distance;
      iVar16 = uVar11 - (uVar18 >> 0x19);
      uVar17 = iVar16 + 9;
      uVar6 = lVar20 + uVar13 + block_start;
      if (max_backward_limit <= uVar6) {
        uVar6 = max_backward_limit;
      }
      uVar2 = (uVar19 >> 0x1b) - 1;
      if (uVar19 < 0x8000000) {
        uVar2 = uVar1 + 0xf;
      }
      ((Command *)(puVar21 + -7))->insert_len_ = (uint32_t)uVar8;
      *(uint *)(puVar21 + -5) = (uVar17 - uVar18) * 0x2000000 | uVar11;
      uVar10 = (ulong)(params->dist).num_direct_distance_codes;
      uVar15 = uVar10 + 0x10;
      if (uVar2 < uVar15) {
        *puVar21 = (ushort)uVar2;
        uVar9 = 0;
      }
      else {
        uVar9 = (params->dist).distance_postfix_bits;
        bVar7 = (byte)uVar9;
        uVar10 = ((uVar2 - uVar10) + (4L << (bVar7 & 0x3f))) - 0x10;
        uVar18 = 0x1f;
        if ((uint)uVar10 != 0) {
          for (; (uint)uVar10 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar19 = (uVar18 ^ 0xffffffe0) + 0x1f;
        uVar18 = (uint)((uVar10 >> ((ulong)uVar19 & 0x3f) & 1) != 0);
        iVar14 = uVar19 - uVar9;
        *puVar21 = (short)(uVar18 + iVar14 * 2 + 0xfffe << (bVar7 & 0x3f)) +
                   (short)uVar15 + (~(ushort)(-1 << (bVar7 & 0x1f)) & (ushort)uVar10) |
                   (short)iVar14 * 0x400;
        uVar9 = (uint32_t)(uVar10 - ((ulong)uVar18 + 2 << ((byte)uVar19 & 0x3f)) >> (bVar7 & 0x3f));
      }
      *(uint32_t *)(puVar21 + -3) = uVar9;
      if (uVar8 < 6) {
        uVar15 = uVar8 & 0xffffffff;
      }
      else if (uVar8 < 0x82) {
        uVar18 = 0x1f;
        uVar19 = (uint)(uVar8 - 2);
        if (uVar19 != 0) {
          for (; uVar19 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar15 = (ulong)((int)(uVar8 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar18 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar8 < 0x842) {
        uVar19 = (uint32_t)uVar8 - 0x42;
        uVar18 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar15 = (ulong)((uVar18 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar15 = 0x15;
        if (0x1841 < uVar8) {
          uVar15 = (ulong)(ushort)(0x17 - (uVar8 < 0x5842));
        }
      }
      if (uVar17 < 10) {
        uVar18 = iVar16 + 7;
      }
      else if (uVar17 < 0x86) {
        uVar19 = iVar16 + 3;
        uVar18 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar18 = (int)((ulong)(long)(int)uVar19 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar18 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar18 = 0x17;
        if (uVar17 < 0x846) {
          uVar18 = 0x1f;
          if (iVar16 - 0x3dU != 0) {
            for (; iVar16 - 0x3dU >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = (uVar18 ^ 0xffe0) + 0x2c;
        }
      }
      uVar3 = (ushort)uVar18;
      uVar4 = (uVar3 & 7) + ((ushort)uVar15 & 7) * 8;
      if ((((*puVar21 & 0x3ff) == 0) && ((ushort)uVar15 < 8)) && (uVar3 < 0x10)) {
        if (7 < uVar3) {
          uVar4 = uVar4 + 0x40;
        }
      }
      else {
        iVar16 = (int)((uVar15 & 0xffff) >> 3) * 3 + ((uVar18 & 0xffff) >> 3);
        uVar4 = uVar4 + ((ushort)(0x520d40 >> ((char)iVar16 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar16 * 0x40 + 0x40;
      }
      puVar21[-1] = uVar4;
      if ((uVar1 <= uVar6) && (uVar2 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar8;
      lVar20 = lVar20 + uVar13 + (ulong)uVar11;
      puVar21 = puVar21 + 8;
    } while (uVar5 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar20);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
                                const size_t block_start,
                                const size_t max_backward_limit,
                                const ZopfliNode* nodes,
                                int* dist_cache,
                                size_t* last_insert_len,
                                const BrotliEncoderParams* params,
                                Command* commands,
                                size_t* num_literals) {
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t max_distance =
          BROTLI_MIN(size_t, block_start + pos, max_backward_limit);
      BROTLI_BOOL is_dictionary = TO_BROTLI_BOOL(distance > max_distance + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}